

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_query(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
           int parseSeparator)

{
  char cVar1;
  ulong uVar2;
  curi_settings *pcVar3;
  _func_int_void_ptr_char_ptr_size_t *callback;
  curi_status cVar4;
  curi_status cVar5;
  int iVar6;
  char *pcVar7;
  curi_settings *settings_00;
  size_t sVar8;
  curi_status cVar9;
  curi_settings *userData_00;
  bool bVar10;
  
  if (parseSeparator == 0) {
    cVar4 = curi_status_success;
  }
  else {
    uVar2 = *offset;
    pcVar7 = "";
    if (uVar2 < len) {
      pcVar7 = uri + uVar2;
    }
    *offset = uVar2 + 1;
    cVar4 = (uint)(*pcVar7 != '?') * 2;
  }
  pcVar3 = (curi_settings *)*offset;
  if (cVar4 == curi_status_success) {
    if ((((settings->query_item_null_callback == (_func_int_void_ptr_char_ptr_size_t *)0x0) &&
         (settings->query_item_int_callback == (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) &&
        (settings->query_item_double_callback == (_func_int_void_ptr_char_ptr_size_t_double *)0x0))
       && (settings_00 = pcVar3, userData_00 = settings,
          settings->query_item_str_callback ==
          (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0)) {
      do {
        sVar8 = *offset;
        cVar4 = parse_query_fragment_char(uri,len,offset,settings_00,userData_00);
      } while (cVar4 == curi_status_success);
      *offset = sVar8;
      cVar4 = curi_status_success;
    }
    else {
      cVar4 = parse_query_item(uri,len,offset,settings,userData);
      if (cVar4 == curi_status_success) {
        cVar9 = curi_status_success;
        do {
          uVar2 = *offset;
          cVar1 = settings->query_item_separator;
          pcVar7 = uri + uVar2;
          if (len <= uVar2) {
            pcVar7 = "";
          }
          *offset = uVar2 + 1;
          bVar10 = *pcVar7 != cVar1;
          if (bVar10) {
            cVar5 = (uint)bVar10 * 2;
          }
          else {
            cVar5 = parse_query_item(uri,len,offset,settings,userData);
          }
          cVar4 = cVar5;
          if (cVar5 == curi_status_error) {
            *offset = uVar2;
            cVar4 = cVar9;
          }
          cVar9 = cVar4;
        } while (cVar5 == curi_status_success);
      }
    }
  }
  if (cVar4 == curi_status_success) {
    sVar8 = (long)*offset - (long)pcVar3;
    callback = settings->query_callback;
    if (settings->url_decode != 0) {
      cVar4 = handle_str_callback_url_decoded(callback,uri + (long)pcVar3,sVar8,settings,userData);
      return cVar4;
    }
    cVar4 = curi_status_success;
    if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && (curi_settings *)*offset != pcVar3)
    {
      iVar6 = (*callback)(userData,uri + (long)pcVar3,sVar8);
      cVar4 = (curi_status)(iVar6 == 0);
    }
  }
  return cVar4;
}

Assistant:

static curi_status parse_query(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int parseSeparator)
{
    // If not interested in individual items,
    //      query = "?" *query_fragment_char
    // if interested,
    //      query = "?" query_item *(query_item_separator query_item)
    //      query_item_separator = settings->query_item_separator (default is "&")

    curi_status status = curi_status_success;

    size_t queryStartOffset;

    if (parseSeparator && status == curi_status_success)
        status = parse_char('?', uri, len, offset, settings, userData);

    queryStartOffset = *offset;

    if (status == curi_status_success)
    {
        if (!settings->query_item_null_callback && !settings->query_item_int_callback && !settings->query_item_double_callback && !settings->query_item_str_callback)
        {
            while (status == curi_status_success)
            {
                size_t previousOffset = *offset;

                status = parse_query_fragment_char(uri, len, offset, settings, userData);

                if (status != curi_status_success)
                    *offset = previousOffset;
            }

            status = curi_status_success;
        }
        else
        {
            status = parse_query_item(uri, len, offset, settings, userData);

            if (status == curi_status_success)
            {
                curi_status tryStatus = curi_status_success;
                while (tryStatus == curi_status_success)
                {
                    size_t previousOffset = *offset;

                    tryStatus = parse_char(settings->query_item_separator, uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_success)
                        tryStatus = parse_query_item(uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_error)
                        *offset = previousOffset;
                    else
                        status = tryStatus;
                }
            }
        }
    }

    if (status == curi_status_success)
        status = handle_query(uri + queryStartOffset, *offset - queryStartOffset, settings, userData);

    return status;
}